

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_dechex(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  
  if (nArg < 1) {
    jx9_result_null(pCtx);
  }
  else {
    uVar1 = jx9_value_to_int(*apArg);
    jx9_result_string_format(pCtx,"%x",(ulong)uVar1);
  }
  return 0;
}

Assistant:

static int jx9Builtin_dechex(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int iVal;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the given number */
	iVal = jx9_value_to_int(apArg[0]);
	/* Format */
	jx9_result_string_format(pCtx, "%x", iVal);
	return JX9_OK;
}